

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_to_constructor.cpp
# Opt level: O2

int main(void)

{
  uint __line;
  wrapper<app,_boost::ext::di::v1_3_0::wrappers::unique<boost::ext::di::v1_3_0::scopes::unique,_app>_>
  wVar1;
  char *__assertion;
  i injector;
  
  injector.super_injector_t.
  super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>_>_>_>
  .
  super_dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>_>
  .
  super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>
  .super_ctor_arg<example,_0,_int>.value = 0x2a;
  injector.super_injector_t.
  super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>_>_>_>
  .
  super_dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>_>
  .
  super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>
  .super_ctor_arg<example,_1,_double>.value = 87.0;
  wVar1 = boost::ext::di::v1_3_0::core::
          injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,example,example,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,0,int>,boost::ext::di::v1_3_0::core::ctor_arg<example,1,double>>>>>
          ::
          create_successful_impl__<boost::ext::di::v1_3_0::aux::integral_constant<bool,true>,app,boost::ext::di::v1_3_0::no_name>
                    ((injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,example,example,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,0,int>,boost::ext::di::v1_3_0::core::ctor_arg<example,1,double>>>>>
                      *)&injector);
  if (*(int *)((long)wVar1.wrapper_.object.ex + 8) == 0x2a) {
    if ((*(double *)wVar1.wrapper_.object.ex != 87.0) || (NAN(*(double *)wVar1.wrapper_.object.ex)))
    {
      __assertion = "87.0 == object.ex.d";
      __line = 0x25;
    }
    else {
      injector.super_injector_t.
      super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>_>_>_>
      .
      super_dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>_>
      .
      super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>
      .super_ctor_arg<example,_0,_int>.value = 0x2a;
      injector.super_injector_t.
      super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>_>_>_>
      .
      super_dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>_>
      .
      super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>
      .super_ctor_arg<example,_1,_double>.value = 87.0;
      wVar1 = boost::ext::di::v1_3_0::core::
              injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,example,example,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,0,int>,boost::ext::di::v1_3_0::core::ctor_arg<example,1,double>>>>>
              ::
              create_successful_impl__<boost::ext::di::v1_3_0::aux::integral_constant<bool,true>,app,boost::ext::di::v1_3_0::no_name>
                        ((injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,example,example,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,0,int>,boost::ext::di::v1_3_0::core::ctor_arg<example,1,double>>>>>
                          *)&injector);
      if (*(int *)((long)wVar1.wrapper_.object.ex + 8) == 0x2a) {
        if ((*(double *)wVar1.wrapper_.object.ex != 87.0) ||
           (NAN(*(double *)wVar1.wrapper_.object.ex))) {
          __assertion = "87.0 == object.ex.d";
          __line = 0x33;
        }
        else {
          injector.super_injector_t.
          super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>_>_>_>
          .
          super_dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>_>
          .
          super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>
          .super_ctor_arg<example,_0,_int>.value = 0x2a;
          injector.super_injector_t.
          super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>_>_>_>
          .
          super_dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>_>
          .
          super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>
          .super_ctor_arg<example,_1,_double>.value =
               (double)&boost::ext::di::v1_3_0::placeholders::_;
          injector.super_injector_t._16_8_ = 0x4055c00000000000;
          wVar1 = boost::ext::di::v1_3_0::core::
                  injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,example,example,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,0,int>,boost::ext::di::v1_3_0::core::ctor_arg<example,1,boost::ext::di::v1_3_0::placeholders::arg_const&>>>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,double,double,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>
                  ::
                  create_successful_impl__<boost::ext::di::v1_3_0::aux::integral_constant<bool,true>,app,boost::ext::di::v1_3_0::no_name>
                            ((injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,example,example,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,0,int>,boost::ext::di::v1_3_0::core::ctor_arg<example,1,boost::ext::di::v1_3_0::placeholders::arg_const&>>>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,double,double,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>
                              *)&injector);
          if (*(int *)((long)wVar1.wrapper_.object.ex + 8) == 0x2a) {
            if ((*(double *)wVar1.wrapper_.object.ex != 87.0) ||
               (NAN(*(double *)wVar1.wrapper_.object.ex))) {
              __assertion = "87.0 == object.ex.d";
              __line = 0x42;
            }
            else {
              injector.super_injector_t.
              super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>_>_>_>
              .
              super_dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>_>
              .
              super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>
              .super_ctor_arg<example,_0,_int>.value = 0x1020a2;
              injector.super_injector_t.
              super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>_>_>_>
              .
              super_dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>_>
              .
              super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>
              ._4_4_ = 0;
              injector.super_injector_t.
              super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>_>_>_>
              .
              super_dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>_>
              .
              super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>
              .super_ctor_arg<example,_1,_double>.value = 87.0;
              injector.super_injector_t._16_4_ = 0x2a;
              wVar1 = boost::ext::di::v1_3_0::core::
                      injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,example,example,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,0,boost::ext::di::v1_3_0::placeholders::arg_const&>,boost::ext::di::v1_3_0::core::ctor_arg<example,1,double>>>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>
                      ::
                      create_successful_impl__<boost::ext::di::v1_3_0::aux::integral_constant<bool,true>,app,boost::ext::di::v1_3_0::no_name>
                                ((injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,example,example,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,0,boost::ext::di::v1_3_0::placeholders::arg_const&>,boost::ext::di::v1_3_0::core::ctor_arg<example,1,double>>>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>
                                  *)&injector);
              if (*(int *)((long)wVar1.wrapper_.object.ex + 8) == 0x2a) {
                if ((*(double *)wVar1.wrapper_.object.ex == 87.0) &&
                   (!NAN(*(double *)wVar1.wrapper_.object.ex))) {
                  return 0;
                }
                __assertion = "87.0 == object.ex.d";
                __line = 0x50;
              }
              else {
                __assertion = "42 == object.ex.i";
                __line = 0x4f;
              }
            }
          }
          else {
            __assertion = "42 == object.ex.i";
            __line = 0x41;
          }
        }
      }
      else {
        __assertion = "42 == object.ex.i";
        __line = 0x32;
      }
    }
  }
  else {
    __assertion = "42 == object.ex.i";
    __line = 0x24;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/bind_to_constructor.cpp"
                ,__line,"int main()");
}

Assistant:

int main() {
  {
    // clang-format off
    const auto injector = di::make_injector(
      di::bind<example>()(42, 87.0) // or di::bind<example>().to<example>(42, 87.0)
    );
    // clang-format on

    auto object = di::create<app>(injector);

    assert(42 == object.ex.i);
    assert(87.0 == object.ex.d);
  }

#if defined(__cpp_variable_templates)
  {
    // clang-format off
    const auto injector = di::make_injector(
      di::bind<example>(42, 87.0)
    );
    // clang-format on

    auto object = di::create<app>(injector);

    assert(42 == object.ex.i);
    assert(87.0 == object.ex.d);
  }
#endif

  {
    // clang-format off
    const auto injector = di::make_injector(
      di::bind<example>()(42, di::placeholders::_), // inject second argument
      di::bind<>().to(87.0)
    );
    // clang-format on

    auto object = di::create<app>(injector);

    assert(42 == object.ex.i);
    assert(87.0 == object.ex.d);
  }

  {
    // clang-format off
    const auto injector = di::make_injector(
      di::bind<example>()(di::placeholders::_, 87.0), // inject first argument
      di::bind<>().to(42)
    );
    // clang-format on

    auto object = di::create<app>(injector);

    assert(42 == object.ex.i);
    assert(87.0 == object.ex.d);
  }
}